

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_GetMaxLevel(Fraig_Man_t *pMan)

{
  int local_1c;
  int local_18;
  int local_14;
  int i;
  int nLevelMax;
  Fraig_Man_t *pMan_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < pMan->vOutputs->nSize; local_18 = local_18 + 1) {
    if (*(int *)(((ulong)pMan->vOutputs->pArray[local_18] & 0xfffffffffffffffe) + 8) < local_14) {
      local_1c = local_14;
    }
    else {
      local_1c = *(int *)(((ulong)pMan->vOutputs->pArray[local_18] & 0xfffffffffffffffe) + 8);
    }
    local_14 = local_1c;
  }
  return local_14;
}

Assistant:

int Fraig_GetMaxLevel( Fraig_Man_t * pMan )
{
    int nLevelMax, i;
    nLevelMax = 0;
    for ( i = 0; i < pMan->vOutputs->nSize; i++ )
        nLevelMax = nLevelMax > Fraig_Regular(pMan->vOutputs->pArray[i])->Level? 
                nLevelMax : Fraig_Regular(pMan->vOutputs->pArray[i])->Level;
    return nLevelMax;
}